

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O3

void __thiscall
draco::SequentialIntegerAttributeDecoder::PreparePortableAttribute
          (SequentialIntegerAttributeDecoder *this,int num_entries,int num_components)

{
  Type attribute_type;
  pointer pIVar1;
  PointAttribute *__ptr;
  int32_t iVar2;
  PointAttribute *this_00;
  PointAttribute *local_70;
  GeometryAttribute ga;
  
  GeometryAttribute::GeometryAttribute(&ga);
  attribute_type =
       (((this->super_SequentialAttributeDecoder).attribute_)->super_GeometryAttribute).
       attribute_type_;
  iVar2 = DataTypeLength(DT_INT32);
  GeometryAttribute::Init
            (&ga,attribute_type,(DataBuffer *)0x0,(uint8_t)num_components,DT_INT32,false,
             (long)(iVar2 * num_components),0);
  this_00 = (PointAttribute *)operator_new(0x70);
  PointAttribute::PointAttribute(this_00,&ga);
  this_00->identity_mapping_ = true;
  pIVar1 = *(pointer *)
            &(this_00->indices_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl;
  if (*(pointer *)((long)&(this_00->indices_map_).vector_ + 8) != pIVar1) {
    *(pointer *)((long)&(this_00->indices_map_).vector_ + 8) = pIVar1;
  }
  local_70 = this_00;
  PointAttribute::Reset(this_00,(long)num_entries);
  (this_00->super_GeometryAttribute).unique_id_ =
       (((this->super_SequentialAttributeDecoder).attribute_)->super_GeometryAttribute).unique_id_;
  local_70 = (PointAttribute *)0x0;
  __ptr = (this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
          super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
          _M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  (this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>._M_t.
  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
  super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl = this_00;
  if (__ptr != (PointAttribute *)0x0) {
    std::default_delete<draco::PointAttribute>::operator()
              ((default_delete<draco::PointAttribute> *)
               &(this->super_SequentialAttributeDecoder).portable_attribute_,__ptr);
    if (local_70 != (PointAttribute *)0x0) {
      std::default_delete<draco::PointAttribute>::operator()
                ((default_delete<draco::PointAttribute> *)&local_70,local_70);
    }
  }
  return;
}

Assistant:

void SequentialIntegerAttributeDecoder::PreparePortableAttribute(
    int num_entries, int num_components) {
  GeometryAttribute ga;
  ga.Init(attribute()->attribute_type(), nullptr, num_components, DT_INT32,
          false, num_components * DataTypeLength(DT_INT32), 0);
  std::unique_ptr<PointAttribute> port_att(new PointAttribute(ga));
  port_att->SetIdentityMapping();
  port_att->Reset(num_entries);
  port_att->set_unique_id(attribute()->unique_id());
  SetPortableAttribute(std::move(port_att));
}